

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O0

FxExpression * ParseRandom2(FScanner *sc,PClassActor *cls)

{
  FxExpression *m;
  FxExpression *r;
  bool bVar1;
  FxRandom2 *this;
  size_t size;
  FScriptPosition local_38;
  FxExpression *local_28;
  FxExpression *mask;
  FRandom *rng;
  PClassActor *cls_local;
  FScanner *sc_local;
  
  rng = (FRandom *)cls;
  cls_local = (PClassActor *)sc;
  mask = (FxExpression *)ParseRNG(sc);
  local_28 = (FxExpression *)0x0;
  FScanner::MustGetToken((FScanner *)cls_local,0x28);
  size = 0x29;
  bVar1 = FScanner::CheckToken((FScanner *)cls_local,0x29);
  if (!bVar1) {
    local_28 = ParseExpressionM((FScanner *)cls_local,(PClassActor *)rng);
    size = 0x29;
    FScanner::MustGetToken((FScanner *)cls_local,0x29);
  }
  this = (FxRandom2 *)FxExpression::operator_new((FxExpression *)0x40,size);
  r = mask;
  m = local_28;
  FScriptPosition::FScriptPosition(&local_38,(FScanner *)cls_local);
  FxRandom2::FxRandom2(this,(FRandom *)r,m,&local_38,true);
  FScriptPosition::~FScriptPosition(&local_38);
  return &this->super_FxExpression;
}

Assistant:

static FxExpression *ParseRandom2(FScanner &sc, PClassActor *cls)
{
	FRandom *rng = ParseRNG(sc);
	FxExpression *mask = NULL;

	sc.MustGetToken('(');

	if (!sc.CheckToken(')'))
	{
		mask = ParseExpressionM(sc, cls);
		sc.MustGetToken(')');
	}
	return new FxRandom2(rng, mask, sc, true);
}